

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

sexp sexp_string_cmp_op(sexp ctx,sexp self,sexp_sint_t n,sexp str1,sexp str2,sexp ci)

{
  int iVar1;
  int *in_RCX;
  int *in_R8;
  long in_R9;
  sexp_sint_t diff;
  sexp_sint_t len;
  sexp_sint_t len2;
  sexp_sint_t len1;
  size_t local_60;
  sexp in_stack_ffffffffffffffa8;
  long lVar2;
  sexp_uint_t in_stack_ffffffffffffffb0;
  sexp in_stack_ffffffffffffffb8;
  size_t sVar3;
  sexp in_stack_ffffffffffffffc0;
  size_t sVar4;
  sexp local_8;
  
  if ((((ulong)in_RCX & 3) == 0) && (*in_RCX == 9)) {
    if ((((ulong)in_R8 & 3) == 0) && (*in_R8 == 9)) {
      sVar4 = *(size_t *)(in_RCX + 6);
      sVar3 = *(size_t *)(in_R8 + 6);
      local_60 = sVar3;
      if ((long)sVar4 < (long)sVar3) {
        local_60 = sVar4;
      }
      if (in_R9 == 0x3e) {
        iVar1 = strncmp((char *)(*(long *)(in_RCX + 2) + 0x10 + *(long *)(in_RCX + 4)),
                        (char *)(*(long *)(in_R8 + 2) + 0x10 + *(long *)(in_R8 + 4)),local_60);
      }
      else {
        iVar1 = strncasecmp((char *)(*(long *)(in_RCX + 2) + 0x10 + *(long *)(in_RCX + 4)),
                            (char *)(*(long *)(in_R8 + 2) + 0x10 + *(long *)(in_R8 + 4)),local_60);
      }
      lVar2 = (long)iVar1;
      if (lVar2 == 0) {
        lVar2 = sVar4 - sVar3;
      }
      local_8 = (sexp)(lVar2 << 1 | 1);
    }
    else {
      local_8 = sexp_type_exception(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                                    in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    }
  }
  else {
    local_8 = sexp_type_exception(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                                  in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  return local_8;
}

Assistant:

sexp sexp_string_cmp_op (sexp ctx, sexp self, sexp_sint_t n, sexp str1, sexp str2, sexp ci) {
  sexp_sint_t len1, len2, len, diff;
  sexp_assert_type(ctx, sexp_stringp, SEXP_STRING, str1);
  sexp_assert_type(ctx, sexp_stringp, SEXP_STRING, str2);
  len1 = sexp_string_size(str1);
  len2 = sexp_string_size(str2);
  len = ((len1<len2) ? len1 : len2);
  if (ci==SEXP_FALSE)
    diff = strncmp(sexp_string_data(str1), sexp_string_data(str2), len);
  else
    diff = strncasecmp(sexp_string_data(str1), sexp_string_data(str2), len);
  if (! diff)
    diff = len1 - len2;
  return sexp_make_fixnum(diff);
}